

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

void __thiscall
cmCTestBuildHandler::ProcessBuffer
          (cmCTestBuildHandler *this,char *data,int length,size_t *tick,size_t tick_len,ostream *ofs
          ,t_BuildProcessingQueueType *queue)

{
  cmCTest *pcVar1;
  reference pcVar2;
  bool bVar3;
  bool bVar4;
  reference pcVar5;
  reference __lhs;
  pointer pcVar6;
  size_type sVar7;
  char *pcVar8;
  ostream *poVar9;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<char,_std::allocator<char>_> *this_01;
  cmCTestLogWrite local_918;
  string local_908 [32];
  cmCTestLogWrite local_8e8;
  undefined1 local_8d8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_760 [32];
  ostringstream local_740 [8];
  ostringstream cmCTestLog_msg_1;
  string local_5c8 [32];
  ostringstream local_5a8 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_428 [4];
  int tickDisplayed;
  iterator local_408;
  _Self local_3e8;
  const_iterator local_3c8;
  iterator local_3a8;
  const_iterator local_388;
  allocator local_361;
  value_type local_360;
  __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
  local_340;
  __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
  local_338;
  cmCTestBuildErrorWarning *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  iterator local_308;
  iterator local_2e8;
  undefined1 local_2c8 [8];
  iterator pcit;
  undefined1 local_290 [7];
  bool found;
  cmCTestBuildErrorWarning errorwarning;
  _Self local_1c0;
  const_iterator local_1a0;
  iterator local_180;
  const_iterator local_160;
  int local_13c;
  iterator iStack_138;
  int lineType;
  reference local_130;
  char *line;
  char *local_120;
  _Deque_iterator<char,_char_&,_char_*> local_118;
  iterator local_f8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_d8;
  const_iterator local_d0;
  iterator local_c8;
  iterator local_a8;
  iterator local_88;
  undefined1 local_68 [8];
  iterator it;
  char *ptr;
  size_type tick_line_len;
  ostream *ofs_local;
  size_t tick_len_local;
  size_t *tick_local;
  int length_local;
  char *data_local;
  cmCTestBuildHandler *this_local;
  
  for (it._M_node = (_Map_pointer)data; it._M_node < data + length;
      it._M_node = (_Map_pointer)((long)it._M_node + 1)) {
    std::deque<char,_std::allocator<char>_>::push_back(queue,(value_type_conflict *)it._M_node);
  }
  this->BuildOutputLogSize = (long)length + this->BuildOutputLogSize;
  while( true ) {
    std::_Deque_iterator<char,_char_&,_char_*>::_Deque_iterator
              ((_Deque_iterator<char,_char_&,_char_*> *)local_68);
    std::deque<char,_std::allocator<char>_>::begin(&local_88,queue);
    local_68 = (undefined1  [8])local_88._M_cur;
    it._M_cur = local_88._M_first;
    it._M_first = local_88._M_last;
    it._M_last = (_Elt_pointer)local_88._M_node;
    while( true ) {
      std::deque<char,_std::allocator<char>_>::end(&local_a8,queue);
      bVar3 = std::operator!=((_Self *)local_68,&local_a8);
      if ((!bVar3) ||
         (pcVar5 = std::_Deque_iterator<char,_char_&,_char_*>::operator*
                             ((_Deque_iterator<char,_char_&,_char_*> *)local_68), *pcVar5 == '\n'))
      break;
      std::_Deque_iterator<char,_char_&,_char_*>::operator++
                ((_Deque_iterator<char,_char_&,_char_*> *)local_68);
    }
    if (this->MaxWarnings <= this->TotalWarnings) {
      this->WarningQuotaReached = true;
    }
    if (this->MaxErrors <= this->TotalErrors) {
      this->ErrorQuotaReached = true;
    }
    std::deque<char,_std::allocator<char>_>::end(&local_c8,queue);
    bVar3 = std::operator!=((_Self *)local_68,&local_c8);
    if (!bVar3) break;
    this_01 = &this->CurrentProcessingLine;
    std::vector<char,_std::allocator<char>_>::clear(this_01);
    local_d8._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(this_01);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_d0,
               &local_d8);
    std::deque<char,_std::allocator<char>_>::begin(&local_f8,queue);
    std::_Deque_iterator<char,_char_&,_char_*>::_Deque_iterator
              (&local_118,(_Deque_iterator<char,_char_&,_char_*> *)local_68);
    local_120 = (char *)std::vector<char,std::allocator<char>>::
                        insert<std::_Deque_iterator<char,char&,char*>,void>
                                  ((vector<char,std::allocator<char>> *)this_01,local_d0,&local_f8,
                                   &local_118);
    line._7_1_ = 0;
    std::vector<char,_std::allocator<char>_>::push_back
              (this_01,(value_type_conflict *)((long)&line + 7));
    iStack_138 = std::vector<char,_std::allocator<char>_>::begin(this_01);
    local_130 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                operator*(&stack0xfffffffffffffec8);
    local_13c = ProcessSingleLine(this,local_130);
    std::deque<char,_std::allocator<char>_>::begin(&local_180,queue);
    std::_Deque_iterator<char,char_const&,char_const*>::
    _Deque_iterator<std::_Deque_iterator<char,char&,char*>,void>
              ((_Deque_iterator<char,char_const&,char_const*> *)&local_160,&local_180);
    std::operator+(&local_1c0,(_Deque_iterator<char,_char_&,_char_*> *)local_68,1);
    std::_Deque_iterator<char,char_const&,char_const*>::
    _Deque_iterator<std::_Deque_iterator<char,char&,char*>,void>
              ((_Deque_iterator<char,char_const&,char_const*> *)&local_1a0,&local_1c0);
    std::deque<char,_std::allocator<char>_>::erase
              ((iterator *)((long)&errorwarning.PostContext.field_2 + 8),queue,&local_160,&local_1a0
              );
    cmCTestBuildErrorWarning::cmCTestBuildErrorWarning((cmCTestBuildErrorWarning *)local_290);
    bVar3 = false;
    if (local_13c == 1) {
      this->LastTickChar = '*';
      local_290[0] = false;
      bVar3 = true;
      this->TotalWarnings = this->TotalWarnings + 1;
    }
    else if (local_13c == 2) {
      this->LastTickChar = '!';
      local_290[0] = true;
      bVar3 = true;
      this->TotalErrors = this->TotalErrors + 1;
    }
    if (bVar3) {
      register0x00000000 = (int)this->OutputLineCounter + 1;
      std::__cxx11::string::operator=((string *)&errorwarning,local_130);
      std::__cxx11::string::operator=((string *)&errorwarning.LineNumber,"");
      std::__cxx11::string::operator=
                ((string *)(errorwarning.PreContext.field_2._M_local_buf + 8),"");
      std::
      _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
      ::_Deque_iterator((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                         *)local_2c8);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin(&local_2e8,&this->PreContext);
      local_2c8 = (undefined1  [8])local_2e8._M_cur;
      pcit._M_cur = local_2e8._M_first;
      pcit._M_first = local_2e8._M_last;
      pcit._M_last = (_Elt_pointer)local_2e8._M_node;
      while( true ) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&local_308,&this->PreContext);
        bVar3 = std::operator!=((_Self *)local_2c8,&local_308);
        if (!bVar3) break;
        __lhs = std::
                _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                             *)local_2c8);
        std::operator+(&local_328,__lhs,"\n");
        std::__cxx11::string::operator+=((string *)&errorwarning.LineNumber,(string *)&local_328);
        std::__cxx11::string::~string((string *)&local_328);
        std::
        _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
        ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                      *)local_2c8);
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->PreContext);
      std::
      vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
      ::push_back(&this->ErrorsAndWarnings,(value_type *)local_290);
      local_338._M_current =
           (cmCTestBuildErrorWarning *)
           std::
           vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
           ::end(&this->ErrorsAndWarnings);
      local_330 = (cmCTestBuildErrorWarning *)
                  __gnu_cxx::
                  __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                  ::operator-(&local_338,1);
      (this->LastErrorOrWarning)._M_current = local_330;
      this->PostContextCount = 0;
    }
    else {
      bVar4 = std::
              vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
              ::empty(&this->ErrorsAndWarnings);
      bVar3 = false;
      if (!bVar4) {
        local_340._M_current =
             (cmCTestBuildErrorWarning *)
             std::
             vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
             ::end(&this->ErrorsAndWarnings);
        bVar4 = __gnu_cxx::operator!=(&this->LastErrorOrWarning,&local_340);
        bVar3 = false;
        if (bVar4) {
          bVar3 = this->PostContextCount < this->MaxPostContext;
        }
      }
      pcVar2 = local_130;
      if (bVar3) {
        this->PostContextCount = this->PostContextCount + 1;
        pcVar6 = __gnu_cxx::
                 __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                 ::operator->(&this->LastErrorOrWarning);
        std::__cxx11::string::operator+=((string *)&pcVar6->PostContext,pcVar2);
        if (this->PostContextCount < this->MaxPostContext) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                   ::operator->(&this->LastErrorOrWarning);
          std::__cxx11::string::operator+=((string *)&pcVar6->PostContext,"\n");
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_360,pcVar2,&local_361);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->PreContext,&local_360);
        std::__cxx11::string::~string((string *)&local_360);
        std::allocator<char>::~allocator((allocator<char> *)&local_361);
        sVar7 = std::
                deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->PreContext);
        if (this->MaxPreContext < sVar7) {
          this_00 = &this->PreContext;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(&local_3a8,this_00);
          std::
          _Deque_iterator<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const*>
          ::
          _Deque_iterator<std::_Deque_iterator<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string*>,void>
                    ((_Deque_iterator<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const*>
                      *)&local_388,&local_3a8);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&local_408,this_00);
          std::operator-(&local_3e8,&local_408,this->MaxPreContext);
          std::
          _Deque_iterator<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const*>
          ::
          _Deque_iterator<std::_Deque_iterator<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string*>,void>
                    ((_Deque_iterator<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const*>
                      *)&local_3c8,&local_3e8);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase((iterator *)local_428,this_00,&local_388,&local_3c8);
        }
      }
    }
    this->OutputLineCounter = this->OutputLineCounter + 1;
    cmCTestBuildErrorWarning::~cmCTestBuildErrorWarning((cmCTestBuildErrorWarning *)local_290);
  }
  bVar3 = false;
  while (*tick * tick_len < this->BuildOutputLogSize) {
    *tick = *tick + 1;
    std::__cxx11::ostringstream::ostringstream(local_5a8);
    std::operator<<((ostream *)local_5a8,this->LastTickChar);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x49b,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_5c8);
    std::__cxx11::ostringstream::~ostringstream(local_5a8);
    bVar3 = true;
    if ((*tick % 0x32 == 0) && (*tick != 0)) {
      std::__cxx11::ostringstream::ostringstream(local_740);
      poVar9 = std::operator<<((ostream *)local_740,"  Size: ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->BuildOutputLogSize + 0x200 >> 10);
      poVar9 = std::operator<<(poVar9,"K");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::operator<<(poVar9,"    ");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x4a1,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_760);
      std::__cxx11::ostringstream::~ostringstream(local_740);
    }
  }
  if (bVar3) {
    this->LastTickChar = '.';
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8d8);
  cmCTestLogWrite::cmCTestLogWrite(&local_8e8,data,(long)length);
  ::operator<<((ostream *)local_8d8,&local_8e8);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x4ab,pcVar8,false);
  std::__cxx11::string::~string(local_908);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8d8);
  cmCTestLogWrite::cmCTestLogWrite(&local_918,data,(long)length);
  ::operator<<(ofs,&local_918);
  return;
}

Assistant:

void cmCTestBuildHandler::ProcessBuffer(const char* data, int length,
  size_t& tick, size_t tick_len, std::ostream& ofs,
  t_BuildProcessingQueueType* queue)
{
  const std::string::size_type tick_line_len = 50;
  const char* ptr;
  for ( ptr = data; ptr < data+length; ptr ++ )
    {
    queue->push_back(*ptr);
    }
  this->BuildOutputLogSize += length;

  // until there are any lines left in the buffer
  while ( 1 )
    {
    // Find the end of line
    t_BuildProcessingQueueType::iterator it;
    for ( it = queue->begin();
      it != queue->end();
      ++ it )
      {
      if ( *it == '\n' )
        {
        break;
        }
      }

    // Once certain number of errors or warnings reached, ignore future errors
    // or warnings.
    if ( this->TotalWarnings >= this->MaxWarnings )
      {
      this->WarningQuotaReached = true;
      }
    if ( this->TotalErrors >= this->MaxErrors )
      {
      this->ErrorQuotaReached = true;
      }

    // If the end of line was found
    if ( it != queue->end() )
      {
      // Create a contiguous array for the line
      this->CurrentProcessingLine.clear();
      this->CurrentProcessingLine.insert(this->CurrentProcessingLine.end(),
                                         queue->begin(), it);
      this->CurrentProcessingLine.push_back(0);
      const char* line = &*this->CurrentProcessingLine.begin();

      // Process the line
      int lineType = this->ProcessSingleLine(line);

      // Erase the line from the queue
      queue->erase(queue->begin(), it+1);

      // Depending on the line type, produce error or warning, or nothing
      cmCTestBuildErrorWarning errorwarning;
      bool found = false;
      switch ( lineType )
        {
      case b_WARNING_LINE:
        this->LastTickChar = '*';
        errorwarning.Error = false;
        found = true;
        this->TotalWarnings ++;
        break;
      case b_ERROR_LINE:
        this->LastTickChar = '!';
        errorwarning.Error = true;
        found = true;
        this->TotalErrors ++;
        break;
        }
      if ( found )
        {
        // This is an error or warning, so generate report
        errorwarning.LogLine   = static_cast<int>(this->OutputLineCounter+1);
        errorwarning.Text        = line;
        errorwarning.PreContext  = "";
        errorwarning.PostContext = "";

        // Copy pre-context to report
        std::deque<std::string>::iterator pcit;
        for ( pcit = this->PreContext.begin();
          pcit != this->PreContext.end();
          ++pcit )
          {
          errorwarning.PreContext += *pcit + "\n";
          }
        this->PreContext.clear();

        // Store report
        this->ErrorsAndWarnings.push_back(errorwarning);
        this->LastErrorOrWarning = this->ErrorsAndWarnings.end()-1;
        this->PostContextCount = 0;
        }
      else
        {
        // This is not an error or warning.
        // So, figure out if this is a post-context line
        if ( !this->ErrorsAndWarnings.empty() &&
             this->LastErrorOrWarning != this->ErrorsAndWarnings.end() &&
             this->PostContextCount < this->MaxPostContext )
          {
          this->PostContextCount ++;
          this->LastErrorOrWarning->PostContext += line;
          if ( this->PostContextCount < this->MaxPostContext )
            {
            this->LastErrorOrWarning->PostContext += "\n";
            }
          }
        else
          {
          // Otherwise store pre-context for the next error
          this->PreContext.push_back(line);
          if ( this->PreContext.size() > this->MaxPreContext )
            {
            this->PreContext.erase(this->PreContext.begin(),
              this->PreContext.end()-this->MaxPreContext);
            }
          }
        }
      this->OutputLineCounter ++;
      }
    else
      {
      break;
      }
    }

  // Now that the buffer is processed, display missing ticks
  int tickDisplayed = false;
  while ( this->BuildOutputLogSize > (tick * tick_len) )
    {
    tick ++;
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, this->LastTickChar,
      this->Quiet);
    tickDisplayed = true;
    if ( tick % tick_line_len == 0 && tick > 0 )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Size: "
        << ((this->BuildOutputLogSize + 512) / 1024) << "K" << std::endl
        << "    ", this->Quiet);
      }
    }
  if ( tickDisplayed )
    {
    this->LastTickChar = '.';
    }

  // And if this is verbose output, display the content of the chunk
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
    cmCTestLogWrite(data, length));

  // Always store the chunk to the file
  ofs << cmCTestLogWrite(data, length);
}